

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_sf2.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  allocator<sf2cute::SFInstrumentZone> *this_00;
  SFModulatorItem modulator;
  initializer_list<sf2cute::SFPresetZone> __l;
  initializer_list<sf2cute::SFInstrumentZone> __l_00;
  initializer_list<sf2cute::SFGeneratorItem> __l_01;
  size_type sVar1;
  element_type *this_01;
  string *psVar2;
  element_type *this_02;
  SFModulator source_op;
  SFPresetZone *local_718;
  SFInstrumentZone *local_6d8;
  failure *e;
  exception *e_1;
  ostream local_670 [8];
  ofstream ofs;
  allocator<sf2cute::SFPresetZone> local_46a;
  undefined1 local_469;
  weak_ptr<sf2cute::SFInstrument> local_468;
  SFPresetZone *local_458;
  SFPresetZone local_450;
  undefined1 local_400 [48];
  undefined1 local_3d0 [8];
  shared_ptr<sf2cute::SFPreset> preset_50;
  SFInstrumentZone local_3b8;
  undefined1 local_368 [40];
  undefined1 local_340 [8];
  shared_ptr<sf2cute::SFInstrument> instrument_50;
  SFModulator local_31a;
  SFModulator local_315;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_310;
  undefined1 local_300 [2];
  GenAmountType local_2fe;
  SFGeneratorItem local_2fc;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [10];
  GenAmountType local_2de [2];
  SFGeneratorItem local_2dc;
  iterator local_2d8;
  undefined1 local_2d0 [32];
  weak_ptr<sf2cute::SFSample> local_2b0;
  undefined1 local_2a0 [8];
  SFInstrumentZone instrument_zone;
  int local_248 [2];
  undefined1 local_240 [8];
  undefined1 local_238 [8];
  shared_ptr<sf2cute::SFSample> sample_50;
  vector<short,_std::allocator<short>_> data_50;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1a9;
  string local_1a8;
  undefined1 local_188 [8];
  SoundFont sf2;
  char **argv_local;
  int argc_local;
  
  sf2.software_.field_2._8_8_ = argv;
  sf2cute::SoundFont::SoundFont((SoundFont *)local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"EMU8000",&local_1a9);
  sf2cute::SoundFont::set_sound_engine((SoundFont *)local_188,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"Chipsound",&local_1e1);
  sf2cute::SoundFont::set_bank_name((SoundFont *)local_188,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"ROM",
             (allocator<char> *)
             ((long)&data_50.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sf2cute::SoundFont::set_rom_name((SoundFont *)local_188,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&data_50.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  MakePulseVector((vector<short,_std::allocator<short>_> *)
                  &sample_50.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount,4);
  local_240._4_4_ = 0;
  this = &sample_50.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  sVar1 = std::vector<short,_std::allocator<short>_>::size
                    ((vector<short,_std::allocator<short>_> *)this);
  local_240._0_4_ = (undefined4)sVar1;
  local_248[1] = 0xac44;
  local_248[0] = 0x39;
  instrument_zone.parent_instrument_._4_4_ = 0;
  sf2cute::SoundFont::
  NewSample<char_const(&)[7],std::vector<short,std::allocator<short>>&,int,unsigned_int,int,int,int>
            ((SoundFont *)local_238,(char (*) [7])local_188,
             (vector<short,_std::allocator<short>_> *)"Square",(int *)this,(uint *)(local_240 + 4),
             (int *)local_240,local_248 + 1,local_248);
  std::weak_ptr<sf2cute::SFSample>::weak_ptr<sf2cute::SFSample,void>
            (&local_2b0,(shared_ptr<sf2cute::SFSample> *)local_238);
  sf2cute::GenAmountType::GenAmountType(local_2de,1);
  sf2cute::SFGeneratorItem::SFGeneratorItem(&local_2dc,kSampleModes,(GenAmountType)local_2de);
  local_2d8 = &local_2dc;
  local_2d0._0_8_ = 1;
  std::allocator<sf2cute::SFGeneratorItem>::allocator
            ((allocator<sf2cute::SFGeneratorItem> *)(local_2e8 + 9));
  __l_01._M_len = local_2d0._0_8_;
  __l_01._M_array = local_2d8;
  std::vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>::vector
            ((vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> *)
             (local_2d0 + 8),__l_01,(allocator<sf2cute::SFGeneratorItem> *)(local_2e8 + 9));
  local_2f8._0_8_ = (pointer)0x0;
  local_2f8._8_8_ = (pointer)0x0;
  local_2e8._0_8_ = (pointer)0x0;
  std::vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>::vector
            ((vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> *)
             local_2f8);
  sf2cute::SFInstrumentZone::SFInstrumentZone
            ((SFInstrumentZone *)local_2a0,&local_2b0,
             (vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> *)
             (local_2d0 + 8),
             (vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> *)
             local_2f8);
  std::vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>::~vector
            ((vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> *)
             local_2f8);
  std::vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>::~vector
            ((vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> *)
             (local_2d0 + 8));
  std::allocator<sf2cute::SFGeneratorItem>::~allocator
            ((allocator<sf2cute::SFGeneratorItem> *)(local_2e8 + 9));
  std::weak_ptr<sf2cute::SFSample>::~weak_ptr(&local_2b0);
  sf2cute::GenAmountType::GenAmountType((GenAmountType *)&local_2fe.range,0x26a);
  sf2cute::SFGeneratorItem::SFGeneratorItem(&local_2fc,kReverbEffectsSend,local_2fe);
  sf2cute::SFZone::SetGenerator((SFZone *)local_2a0,local_2fc);
  sf2cute::SFModulator::SFModulator(&local_315,kNoteOnVelocity,kDecrease,kUnipolar,kConcave);
  sf2cute::SFModulator::SFModulator(&local_31a,0);
  source_op.type_ = local_315.type_;
  source_op.controller_ = local_315.controller_;
  source_op.controller_palette_ = local_315.controller_palette_;
  source_op.direction_ = local_315.direction_;
  source_op.polarity_ = local_315.polarity_;
  instrument_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_1_ = local_31a.type_;
  instrument_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_1_ = local_31a.controller_;
  instrument_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._1_1_ = local_31a.controller_palette_;
  instrument_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._2_1_ = local_31a.direction_;
  instrument_50.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._3_1_ = local_31a.polarity_;
  sf2cute::SFModulatorItem::SFModulatorItem
            ((SFModulatorItem *)&local_310,source_op,kInitialAttenuation,0x3c0,
             (SFModulator)
             ((uint5)(uint)local_31a._0_4_ |
             (uint5)instrument_50.
                    super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._4_4_ << 0x20),kLinear);
  modulator.key_.amount_source_op_.controller_ = local_310._M_local_buf[8];
  modulator.key_.amount_source_op_.controller_palette_ = local_310._M_local_buf[9];
  modulator.key_.amount_source_op_.direction_ = local_310._M_local_buf[10];
  modulator.key_.amount_source_op_.polarity_ = local_310._M_local_buf[0xb];
  modulator.key_.amount_source_op_.type_ = local_310._M_local_buf[0xc];
  modulator.key_._13_1_ = local_310._M_local_buf[0xd];
  modulator.amount_ = local_310._14_2_;
  modulator.key_.source_op_.controller_ = local_310._M_local_buf[0];
  modulator.key_.source_op_.controller_palette_ = local_310._M_local_buf[1];
  modulator.key_.source_op_.direction_ = local_310._M_local_buf[2];
  modulator.key_.source_op_.polarity_ = local_310._M_local_buf[3];
  modulator.key_.source_op_.type_ = local_310._M_local_buf[4];
  modulator.key_._5_1_ = local_310._M_local_buf[5];
  modulator.key_.destination_op_ = local_310._M_allocated_capacity._6_2_;
  modulator._16_2_ = local_300;
  sf2cute::SFZone::SetModulator((SFZone *)local_2a0,modulator);
  this_01 = std::__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_238);
  psVar2 = sf2cute::SFSample::name_abi_cxx11_(this_01);
  sf2cute::SFInstrumentZone::SFInstrumentZone(&local_3b8,(SFInstrumentZone *)local_2a0);
  local_368._8_8_ = (pointer)0x1;
  this_00 = (allocator<sf2cute::SFInstrumentZone> *)
            ((long)&preset_50.super___shared_ptr<sf2cute::SFPreset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 7);
  local_368._0_8_ = &local_3b8;
  std::allocator<sf2cute::SFInstrumentZone>::allocator(this_00);
  __l_00._M_len = local_368._8_8_;
  __l_00._M_array = (iterator)local_368._0_8_;
  std::vector<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_>::vector
            ((vector<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_> *)
             (local_368 + 0x10),__l_00,this_00);
  sf2cute::SoundFont::
  NewInstrument<std::__cxx11::string_const&,std::vector<sf2cute::SFInstrumentZone,std::allocator<sf2cute::SFInstrumentZone>>>
            ((SoundFont *)local_340,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
             (vector<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_> *)psVar2
            );
  std::vector<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_>::~vector
            ((vector<sf2cute::SFInstrumentZone,_std::allocator<sf2cute::SFInstrumentZone>_> *)
             (local_368 + 0x10));
  std::allocator<sf2cute::SFInstrumentZone>::~allocator
            ((allocator<sf2cute::SFInstrumentZone> *)
             ((long)&preset_50.super___shared_ptr<sf2cute::SFPreset,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  local_6d8 = (SFInstrumentZone *)local_368;
  do {
    local_6d8 = local_6d8 + -1;
    sf2cute::SFInstrumentZone::~SFInstrumentZone(local_6d8);
  } while (local_6d8 != &local_3b8);
  this_02 = std::
            __shared_ptr_access<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_340);
  psVar2 = sf2cute::SFInstrument::name_abi_cxx11_(this_02);
  local_400._44_4_ = 0;
  local_400._40_4_ = 0;
  local_469 = 1;
  local_458 = &local_450;
  std::weak_ptr<sf2cute::SFInstrument>::weak_ptr<sf2cute::SFInstrument,void>
            (&local_468,(shared_ptr<sf2cute::SFInstrument> *)local_340);
  sf2cute::SFPresetZone::SFPresetZone(&local_450,&local_468);
  local_469 = 0;
  local_400._0_8_ = &local_450;
  local_400._8_8_ = (pointer)0x1;
  std::allocator<sf2cute::SFPresetZone>::allocator(&local_46a);
  __l._M_len = local_400._8_8_;
  __l._M_array = (iterator)local_400._0_8_;
  std::vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>::vector
            ((vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_> *)
             (local_400 + 0x10),__l,&local_46a);
  sf2cute::SoundFont::
  NewPreset<std::__cxx11::string_const&,int,int,std::vector<sf2cute::SFPresetZone,std::allocator<sf2cute::SFPresetZone>>>
            ((SoundFont *)local_3d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
             (int *)psVar2,(int *)(local_400 + 0x2c),
             (vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_> *)
             (local_400 + 0x28));
  std::vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>::~vector
            ((vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_> *)
             (local_400 + 0x10));
  std::allocator<sf2cute::SFPresetZone>::~allocator(&local_46a);
  local_718 = (SFPresetZone *)local_400;
  do {
    local_718 = local_718 + -1;
    sf2cute::SFPresetZone::~SFPresetZone(local_718);
  } while (local_718 != &local_450);
  std::weak_ptr<sf2cute::SFInstrument>::~weak_ptr(&local_468);
  std::ofstream::ofstream(local_670,"output.sf2",_S_bin);
  sf2cute::SoundFont::Write((SoundFont *)local_188,local_670);
  std::ofstream::~ofstream(local_670);
  std::shared_ptr<sf2cute::SFPreset>::~shared_ptr((shared_ptr<sf2cute::SFPreset> *)local_3d0);
  std::shared_ptr<sf2cute::SFInstrument>::~shared_ptr
            ((shared_ptr<sf2cute::SFInstrument> *)local_340);
  sf2cute::SFInstrumentZone::~SFInstrumentZone((SFInstrumentZone *)local_2a0);
  std::shared_ptr<sf2cute::SFSample>::~shared_ptr((shared_ptr<sf2cute::SFSample> *)local_238);
  std::vector<short,_std::allocator<short>_>::~vector
            ((vector<short,_std::allocator<short>_> *)
             &sample_50.super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sf2cute::SoundFont::~SoundFont((SoundFont *)local_188);
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
  SoundFont sf2;

  // Set metadata.
  sf2.set_sound_engine("EMU8000");
  sf2.set_bank_name("Chipsound");
  sf2.set_rom_name("ROM");

  // Construct sample datapoints.
  std::vector<int16_t> data_50 = MakePulseVector(4);

  // Add a sample.
  std::shared_ptr<SFSample> sample_50 = sf2.NewSample(
    "Square",                 // name
    data_50,                  // sample data
    0,                        // start loop
    uint32_t(data_50.size()), // end loop
    44100,                    // sample rate
    57,                       // root key
    0);                       // microtuning

  // Make an instrument zone.
  SFInstrumentZone instrument_zone(sample_50,
    std::vector<SFGeneratorItem>{
      //SFGeneratorItem(SFGenerator::kKeyRange, RangesType(0, 127)),
      //SFGeneratorItem(SFGenerator::kVelRange, RangesType(0, 127)),
      SFGeneratorItem(SFGenerator::kSampleModes, uint16_t(SampleMode::kLoopContinuously)),
    },
    std::vector<SFModulatorItem>{});
  // Add more generators or modulators if necessary.
  instrument_zone.SetGenerator(SFGeneratorItem(SFGenerator::kReverbEffectsSend, 618));
  instrument_zone.SetModulator(SFModulatorItem(
      SFModulator(SFGeneralController::kNoteOnVelocity,
      SFControllerDirection::kDecrease, SFControllerPolarity::kUnipolar,
      SFControllerType::kConcave),
    SFGenerator::kInitialAttenuation,
    960,
    SFModulator(0),
    SFTransform::kLinear));

  // Add an instrument.
  std::shared_ptr<SFInstrument> instrument_50 = sf2.NewInstrument(
    sample_50->name(),
    std::vector<SFInstrumentZone>{
      std::move(instrument_zone)
    });

  // Add a preset.
  std::shared_ptr<SFPreset> preset_50 = sf2.NewPreset(
    instrument_50->name(), 0, 0,
    std::vector<SFPresetZone>{
      SFPresetZone(instrument_50)
    });

  // Print the tree for debugging.
#ifdef SF2CUTE_EXAMPLES_DEBUG_HPP_
  PrintSoundFont(sf2);
#endif

  // Write SoundFont file.
  try {
    std::ofstream ofs("output.sf2", std::ios::binary);
    sf2.Write(ofs);
    return 0;
  }
  catch (const std::fstream::failure & e) {
    // File output error.
    std::cerr << e.what() << std::endl;
    return 1;
  }
  catch (const std::exception & e) {
    // Other errors.
    // For example: Too many samples.
    std::cerr << e.what() << std::endl;
    return 1;
  }
}